

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_imrecv_(void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *message,
                   MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_imrecv_();
  return;
}

Assistant:

void mpiabi_imrecv_(
  void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  MPIABI_Fint * message,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_imrecv_(
    buf,
    count,
    datatype,
    message,
    request,
    ierror
  );
}